

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManCheckConst(Sbd_Man_t *p,int Pivot)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  word *pwVar5;
  abctime aVar6;
  sat_solver *psVar7;
  abctime aVar8;
  word **pVarSims;
  word *pwVar9;
  ulong uVar10;
  uint uVar11;
  Vec_Int_t *p_00;
  uint uVar12;
  int nSizeNew;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int nCares [2];
  
  pwVar4 = Sbd_ObjSim0(p,Pivot);
  pwVar5 = Sbd_ObjSim2(p,Pivot);
  uVar1 = Vec_IntEntry(p->vObj2Var,Pivot);
  nCares[0] = 0;
  nCares[1] = 0;
  aVar6 = Abc_Clock();
  psVar7 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar7;
  aVar8 = Abc_Clock();
  p->timeCnf = p->timeCnf + (aVar8 - aVar6);
  if (p->pSat == (sat_solver *)0x0) {
    p_00 = p->vLutLevs;
    uVar1 = 0;
  }
  else {
    p->vLits->nSize = 0;
    for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
      if ((*pwVar5 >> (uVar15 & 0x3f) & 1) == 0) {
        Vec_IntPush(p->vLits,(int)uVar15);
      }
      else {
        nCares[(*pwVar4 >> (uVar15 & 0x3f) & 1) != 0] =
             nCares[(*pwVar4 >> (uVar15 & 0x3f) & 1) != 0] + 1;
      }
    }
    iVar2 = nCares[0];
    iVar3 = nCares[1];
    if (0 < nCares[0] && 0 < nCares[1]) {
      return -1;
    }
    uVar11 = 1 - nCares[0];
    if (0 < nCares[0]) {
      uVar11 = 0;
    }
    uVar12 = 1 - nCares[1];
    if (0 < nCares[1]) {
      uVar12 = 0;
    }
    nCares[1] = uVar12;
    nCares[0] = uVar11;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Computing %d offset and %d onset minterms for node %d.\n",(ulong)uVar11,(ulong)uVar12,
             (ulong)(uint)Pivot);
    }
    nSizeNew = uVar12 + uVar11;
    if (p->vLits->nSize < nSizeNew) {
      uVar15 = 0;
      while ((uVar15 != 0x40 && (p->vLits->nSize < nSizeNew))) {
        if (iVar3 <= iVar2 != ((*pwVar4 >> (uVar15 & 0x3f) & 1) != 0)) {
          Vec_IntPush(p->vLits,(int)uVar15);
        }
        uVar15 = uVar15 + 1;
      }
    }
    else {
      Vec_IntShrink(p->vLits,nSizeNew);
    }
    uVar11 = 8;
    if (6 < uVar1) {
      uVar11 = uVar1 + 1;
    }
    if (uVar11 == 0) {
      pVarSims = (word **)0x0;
    }
    else {
      pVarSims = (word **)malloc((long)(int)uVar11 << 3);
    }
    lVar13 = 0;
    while( true ) {
      uVar12 = (uint)lVar13;
      if (p->vWinObjs->nSize <= (int)uVar12) break;
      iVar2 = Vec_IntEntry(p->vWinObjs,uVar12);
      pwVar9 = Sbd_ObjSim0(p,iVar2);
      if (uVar12 == uVar11) {
        uVar15 = (ulong)(uVar11 * 2);
        if ((int)uVar11 < 0x10) {
          uVar15 = 0x10;
        }
        uVar14 = (uint)uVar15;
        if ((int)uVar11 < (int)uVar14) {
          uVar11 = uVar14;
          if (pVarSims == (word **)0x0) {
            pVarSims = (word **)malloc(uVar15 << 3);
          }
          else {
            pVarSims = (word **)realloc(pVarSims,uVar15 << 3);
          }
        }
      }
      pVarSims[lVar13] = pwVar9;
      if (iVar2 == Pivot) break;
      lVar13 = lVar13 + 1;
    }
    if (uVar1 != uVar12) {
      __assert_fail("i == PivotVar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x240,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    uVar1 = Sbd_ManCollectConstants(p->pSat,nCares,uVar1,pVarSims,p->vLits);
    free(pVarSims);
    if ((int)uVar1 < 0) {
      for (iVar2 = 0; iVar2 < p->vLits->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(p->vLits,iVar2);
        pwVar5[iVar3 >> 6] = pwVar5[iVar3 >> 6] | 1L << ((byte)iVar3 & 0x3f);
      }
      Sbd_ManPropagateControl(p,Pivot);
      uVar15 = *pwVar5;
      for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
        if ((uVar15 >> (uVar10 & 0x3f) & 1) != 0) {
          nCares[(*pwVar4 >> (uVar10 & 0x3f) & 1) != 0] =
               nCares[(*pwVar4 >> (uVar10 & 0x3f) & 1) != 0] + 1;
        }
      }
      if ((0 < nCares[0]) && (0 < nCares[1])) {
        return -1;
      }
      __assert_fail("nCares[0] >= nMintCount && nCares[1] >= nMintCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x262,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)uVar1,(ulong)(uint)Pivot);
    }
    p_00 = p->vLutLevs;
  }
  Vec_IntWriteEntry(p_00,Pivot,0);
  p->nLuts[0] = p->nLuts[0] + 1;
  return uVar1;
}

Assistant:

int Sbd_ManCheckConst( Sbd_Man_t * p, int Pivot )
{
    int nMintCount = 1;
    Vec_Ptr_t * vSims;
    word * pSims = Sbd_ObjSim0( p, Pivot );
    word * pCtrl = Sbd_ObjSim2( p, Pivot );
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int RetValue, i, iObj, Ind, fFindOnset, nCares[2] = {0};

    abctime clk = Abc_Clock();
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;
    if ( p->pSat == NULL )
    {
        //if ( p->pPars->fVerbose )
        //    printf( "Found stuck-at-%d node %d.\n", 0, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return 0;
    }
    //return -1;
    //Sbd_ManPrintObj( p, Pivot );

    // count the number of on-set and off-set care-set minterms
    Vec_IntClear( p->vLits );
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
        else
            Vec_IntPush( p->vLits, i );
    fFindOnset = (int)(nCares[0] < nCares[1]);
    if ( nCares[0] >= nMintCount && nCares[1] >= nMintCount )
        return -1;
    // find how many do we need
    nCares[0] = nCares[0] < nMintCount ? nMintCount - nCares[0] : 0;
    nCares[1] = nCares[1] < nMintCount ? nMintCount - nCares[1] : 0;

    if ( p->pPars->fVeryVerbose )
        printf( "Computing %d offset and %d onset minterms for node %d.\n", nCares[0], nCares[1], Pivot );

    if ( Vec_IntSize(p->vLits) >= nCares[0] + nCares[1] )
        Vec_IntShrink( p->vLits, nCares[0] + nCares[1] );
    else
    {
        // collect places to insert new minterms
        for ( i = 0; i < 64 && Vec_IntSize(p->vLits) < nCares[0] + nCares[1]; i++ )
            if ( fFindOnset == Abc_TtGetBit(pSims, i) )
                Vec_IntPush( p->vLits, i );
    }
    // collect simulation pointers
    vSims = Vec_PtrAlloc( PivotVar + 1 );
    Vec_IntForEachEntry( p->vWinObjs, iObj, i )
    {
        Vec_PtrPush( vSims, Sbd_ObjSim0(p, iObj) );
        if ( iObj == Pivot )
            break;
    }
    assert( i == PivotVar );
    // compute patterns
    RetValue = Sbd_ManCollectConstants( p->pSat, nCares, PivotVar, (word **)Vec_PtrArray(vSims), p->vLits );
    // print computed miterms
    if ( 0 && RetValue < 0 )
    {
        Vec_Int_t * vPis = Vec_WecEntry(p->vDivLevels, 0);
        int i, k, Ind;
        printf( "Additional minterms:\n" );
        Vec_IntForEachEntry( p->vLits, Ind, k )
        {
            for ( i = 0; i < Vec_IntSize(vPis); i++ )
                printf( "%d", Abc_TtGetBit( (word *)Vec_PtrEntry(vSims, Vec_IntEntry(p->vWinObjs, i)), Ind ) );
            printf( "\n" );
        }
    }
    Vec_PtrFree( vSims );
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    // set controlability of these minterms
    Vec_IntForEachEntry( p->vLits, Ind, i )
        Abc_TtSetBit( pCtrl, Ind );
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    // double check that we now have enough minterms
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
    assert( nCares[0] >= nMintCount && nCares[1] >= nMintCount );
    return -1;
}